

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O3

CURLcode Curl_sasl_create_digest_md5_message
                   (SessionHandle *data,char *chlg64,char *userp,char *passwdp,char *service,
                   char **outptr,size_t *outlen)

{
  undefined8 chlg;
  _Bool _Var1;
  CURLcode CVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uchar *data_00;
  char *pcVar8;
  MD5_context *pMVar9;
  size_t sVar10;
  uchar *inputbuff;
  byte bVar11;
  long lVar12;
  bool bVar13;
  char qop [5];
  uchar digest [16];
  char nonceCount [9];
  char method [13];
  char HA1_hex [33];
  char cnonce [33];
  char HA2_hex [33];
  char nonce [64];
  char resp_hash_hex [33];
  char algorithm [64];
  char realm [128];
  char qop_options [64];
  
  builtin_strncpy(nonceCount,"00000001",9);
  builtin_strncpy(method + 8,"CATE",5);
  builtin_strncpy(method,"AUTHENTI",8);
  builtin_strncpy(qop,"auth",5);
  HA1_hex[0] = '\0';
  HA1_hex[1] = '\0';
  HA1_hex[2] = '\0';
  HA1_hex[3] = '\0';
  HA1_hex[4] = '\0';
  HA1_hex[5] = '\0';
  HA1_hex[6] = '\0';
  HA1_hex[7] = '\0';
  HA2_hex[0] = '\0';
  HA2_hex[1] = '\0';
  HA2_hex[2] = '\0';
  HA2_hex[3] = '\0';
  HA2_hex[4] = '\0';
  HA2_hex[5] = '\0';
  HA2_hex[6] = '\0';
  HA2_hex[7] = '\0';
  if ((*chlg64 != '\0') && (*chlg64 != '=')) {
    CVar2 = Curl_base64_decode(chlg64,(uchar **)HA1_hex,(size_t *)HA2_hex);
    chlg = HA1_hex._0_8_;
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    if (HA1_hex._0_8_ != 0) {
      _Var1 = sasl_digest_get_key_value((char *)HA1_hex._0_8_,"nonce=\"",nonce,0x40,'\"');
      if (_Var1) {
        _Var1 = sasl_digest_get_key_value((char *)chlg,"realm=\"",realm,0x80,'\"');
        if (!_Var1) {
          realm[0] = '\0';
        }
        _Var1 = sasl_digest_get_key_value((char *)chlg,"algorithm=",algorithm,0x40,',');
        if (_Var1) {
          _Var1 = sasl_digest_get_key_value((char *)chlg,"qop=\"",qop_options,0x40,'\"');
          (*Curl_cfree)((void *)chlg);
          CVar2 = CURLE_BAD_CONTENT_ENCODING;
          if (!_Var1) {
            return CURLE_BAD_CONTENT_ENCODING;
          }
          if (algorithm[8] != '\0' || algorithm._0_8_ != 0x737365732d35646d) {
            return CURLE_BAD_CONTENT_ENCODING;
          }
          data_00 = (uchar *)(*Curl_cstrdup)(qop_options);
          if (data_00 == (uchar *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          pcVar8 = strtok_r((char *)data_00,",",(char **)HA1_hex);
          if (pcVar8 != (char *)0x0) {
            bVar13 = false;
            do {
              iVar3 = Curl_raw_equal(pcVar8,"auth");
              bVar11 = 1;
              if (iVar3 == 0) {
                iVar3 = Curl_raw_equal(pcVar8,"auth-int");
                bVar11 = 0;
                if (iVar3 != 0) goto LAB_004cf526;
                iVar3 = Curl_raw_equal(pcVar8,"auth-conf");
                bVar11 = 0;
                if (iVar3 != 0) goto LAB_004cf526;
              }
              else {
LAB_004cf526:
                bVar13 = (bool)(bVar13 | bVar11);
              }
              pcVar8 = strtok_r((char *)0x0,",",(char **)HA1_hex);
            } while (pcVar8 != (char *)0x0);
            (*Curl_cfree)(data_00);
            if (!bVar13) {
              return CURLE_BAD_CONTENT_ENCODING;
            }
            uVar4 = Curl_rand(data);
            uVar5 = Curl_rand(data);
            uVar6 = Curl_rand(data);
            uVar7 = Curl_rand(data);
            curl_msnprintf(cnonce,0x21,"%08x%08x%08x%08x",(ulong)uVar4,uVar5,(ulong)uVar6,
                           (ulong)uVar7);
            pMVar9 = Curl_MD5_init(Curl_DIGEST_MD5);
            CVar2 = CURLE_OUT_OF_MEMORY;
            if (pMVar9 == (MD5_context *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            sVar10 = strlen(userp);
            uVar4 = curlx_uztoui(sVar10);
            Curl_MD5_update(pMVar9,(uchar *)userp,uVar4);
            Curl_MD5_update(pMVar9,":",1);
            sVar10 = strlen(realm);
            uVar4 = curlx_uztoui(sVar10);
            Curl_MD5_update(pMVar9,(uchar *)realm,uVar4);
            Curl_MD5_update(pMVar9,":",1);
            sVar10 = strlen(passwdp);
            uVar4 = curlx_uztoui(sVar10);
            Curl_MD5_update(pMVar9,(uchar *)passwdp,uVar4);
            Curl_MD5_final(pMVar9,digest);
            pMVar9 = Curl_MD5_init(Curl_DIGEST_MD5);
            if (pMVar9 == (MD5_context *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            Curl_MD5_update(pMVar9,digest,0x10);
            Curl_MD5_update(pMVar9,":",1);
            sVar10 = strlen(nonce);
            uVar4 = curlx_uztoui(sVar10);
            Curl_MD5_update(pMVar9,(uchar *)nonce,uVar4);
            Curl_MD5_update(pMVar9,":",1);
            sVar10 = strlen(cnonce);
            uVar4 = curlx_uztoui(sVar10);
            Curl_MD5_update(pMVar9,(uchar *)cnonce,uVar4);
            Curl_MD5_final(pMVar9,digest);
            lVar12 = 0;
            pcVar8 = HA1_hex;
            do {
              curl_msnprintf(pcVar8,3,"%02x",(ulong)digest[lVar12]);
              lVar12 = lVar12 + 1;
              pcVar8 = pcVar8 + 2;
            } while (lVar12 != 0x10);
            data_00 = (uchar *)curl_maprintf("%s/%s",service,realm);
            if (data_00 == (uchar *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            pMVar9 = Curl_MD5_init(Curl_DIGEST_MD5);
            if (pMVar9 != (MD5_context *)0x0) {
              sVar10 = strlen(method);
              uVar4 = curlx_uztoui(sVar10);
              Curl_MD5_update(pMVar9,(uchar *)method,uVar4);
              Curl_MD5_update(pMVar9,":",1);
              sVar10 = strlen((char *)data_00);
              uVar4 = curlx_uztoui(sVar10);
              Curl_MD5_update(pMVar9,data_00,uVar4);
              Curl_MD5_final(pMVar9,digest);
              lVar12 = 0;
              pcVar8 = HA2_hex;
              do {
                curl_msnprintf(pcVar8,3,"%02x",(ulong)digest[lVar12]);
                lVar12 = lVar12 + 1;
                pcVar8 = pcVar8 + 2;
              } while (lVar12 != 0x10);
              pMVar9 = Curl_MD5_init(Curl_DIGEST_MD5);
              if (pMVar9 != (MD5_context *)0x0) {
                Curl_MD5_update(pMVar9,(uchar *)HA1_hex,0x20);
                Curl_MD5_update(pMVar9,":",1);
                sVar10 = strlen(nonce);
                uVar4 = curlx_uztoui(sVar10);
                Curl_MD5_update(pMVar9,(uchar *)nonce,uVar4);
                Curl_MD5_update(pMVar9,":",1);
                sVar10 = strlen(nonceCount);
                uVar4 = curlx_uztoui(sVar10);
                Curl_MD5_update(pMVar9,(uchar *)nonceCount,uVar4);
                Curl_MD5_update(pMVar9,":",1);
                sVar10 = strlen(cnonce);
                uVar4 = curlx_uztoui(sVar10);
                Curl_MD5_update(pMVar9,(uchar *)cnonce,uVar4);
                Curl_MD5_update(pMVar9,":",1);
                sVar10 = strlen(qop);
                uVar4 = curlx_uztoui(sVar10);
                Curl_MD5_update(pMVar9,(uchar *)qop,uVar4);
                Curl_MD5_update(pMVar9,":",1);
                Curl_MD5_update(pMVar9,(uchar *)HA2_hex,0x20);
                Curl_MD5_final(pMVar9,digest);
                pcVar8 = resp_hash_hex;
                lVar12 = 0;
                do {
                  curl_msnprintf(pcVar8,3,"%02x",(ulong)digest[lVar12]);
                  lVar12 = lVar12 + 1;
                  pcVar8 = pcVar8 + 2;
                } while (lVar12 != 0x10);
                inputbuff = (uchar *)curl_maprintf(
                                                  "username=\"%s\",realm=\"%s\",nonce=\"%s\",cnonce=\"%s\",nc=\"%s\",digest-uri=\"%s\",response=%s,qop=%s"
                                                  ,userp,realm,nonce,cnonce,nonceCount,data_00,
                                                  resp_hash_hex,qop);
                (*Curl_cfree)(data_00);
                if (inputbuff == (uchar *)0x0) {
                  return CURLE_OUT_OF_MEMORY;
                }
                CVar2 = Curl_base64_encode(data,(char *)inputbuff,0,outptr,outlen);
                data_00 = inputbuff;
              }
            }
          }
          (*Curl_cfree)(data_00);
          return CVar2;
        }
      }
      (*Curl_cfree)((void *)chlg);
    }
  }
  return CURLE_BAD_CONTENT_ENCODING;
}

Assistant:

CURLcode Curl_sasl_create_digest_md5_message(struct SessionHandle *data,
                                             const char *chlg64,
                                             const char *userp,
                                             const char *passwdp,
                                             const char *service,
                                             char **outptr, size_t *outlen)
{
  CURLcode result = CURLE_OK;
  size_t i;
  MD5_context *ctxt;
  char *response = NULL;
  unsigned char digest[MD5_DIGEST_LEN];
  char HA1_hex[2 * MD5_DIGEST_LEN + 1];
  char HA2_hex[2 * MD5_DIGEST_LEN + 1];
  char resp_hash_hex[2 * MD5_DIGEST_LEN + 1];
  char nonce[64];
  char realm[128];
  char algorithm[64];
  char qop_options[64];
  int qop_values;
  char cnonce[33];
  unsigned int entropy[4];
  char nonceCount[] = "00000001";
  char method[]     = "AUTHENTICATE";
  char qop[]        = DIGEST_QOP_VALUE_STRING_AUTH;
  char *spn         = NULL;

  /* Decode the challange message */
  result = sasl_decode_digest_md5_message(chlg64, nonce, sizeof(nonce),
                                          realm, sizeof(realm),
                                          algorithm, sizeof(algorithm),
                                          qop_options, sizeof(qop_options));
  if(result)
    return result;

  /* We only support md5 sessions */
  if(strcmp(algorithm, "md5-sess") != 0)
    return CURLE_BAD_CONTENT_ENCODING;

  /* Get the qop-values from the qop-options */
  result = sasl_digest_get_qop_values(qop_options, &qop_values);
  if(result)
    return result;

  /* We only support auth quality-of-protection */
  if(!(qop_values & DIGEST_QOP_VALUE_AUTH))
    return CURLE_BAD_CONTENT_ENCODING;

  /* Generate 16 bytes of random data */
  entropy[0] = Curl_rand(data);
  entropy[1] = Curl_rand(data);
  entropy[2] = Curl_rand(data);
  entropy[3] = Curl_rand(data);

  /* Convert the random data into a 32 byte hex string */
  snprintf(cnonce, sizeof(cnonce), "%08x%08x%08x%08x",
           entropy[0], entropy[1], entropy[2], entropy[3]);

  /* So far so good, now calculate A1 and H(A1) according to RFC 2831 */
  ctxt = Curl_MD5_init(Curl_DIGEST_MD5);
  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  Curl_MD5_update(ctxt, (const unsigned char *) userp,
                  curlx_uztoui(strlen(userp)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) realm,
                  curlx_uztoui(strlen(realm)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) passwdp,
                  curlx_uztoui(strlen(passwdp)));
  Curl_MD5_final(ctxt, digest);

  ctxt = Curl_MD5_init(Curl_DIGEST_MD5);
  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  Curl_MD5_update(ctxt, (const unsigned char *) digest, MD5_DIGEST_LEN);
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) nonce,
                  curlx_uztoui(strlen(nonce)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) cnonce,
                  curlx_uztoui(strlen(cnonce)));
  Curl_MD5_final(ctxt, digest);

  /* Convert calculated 16 octet hex into 32 bytes string */
  for(i = 0; i < MD5_DIGEST_LEN; i++)
    snprintf(&HA1_hex[2 * i], 3, "%02x", digest[i]);

  /* Generate our SPN */
  spn = Curl_sasl_build_spn(service, realm);
  if(!spn)
    return CURLE_OUT_OF_MEMORY;

  /* Calculate H(A2) */
  ctxt = Curl_MD5_init(Curl_DIGEST_MD5);
  if(!ctxt) {
    Curl_safefree(spn);

    return CURLE_OUT_OF_MEMORY;
  }

  Curl_MD5_update(ctxt, (const unsigned char *) method,
                  curlx_uztoui(strlen(method)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) spn,
                  curlx_uztoui(strlen(spn)));
  Curl_MD5_final(ctxt, digest);

  for(i = 0; i < MD5_DIGEST_LEN; i++)
    snprintf(&HA2_hex[2 * i], 3, "%02x", digest[i]);

  /* Now calculate the response hash */
  ctxt = Curl_MD5_init(Curl_DIGEST_MD5);
  if(!ctxt) {
    Curl_safefree(spn);

    return CURLE_OUT_OF_MEMORY;
  }

  Curl_MD5_update(ctxt, (const unsigned char *) HA1_hex, 2 * MD5_DIGEST_LEN);
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) nonce,
                  curlx_uztoui(strlen(nonce)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);

  Curl_MD5_update(ctxt, (const unsigned char *) nonceCount,
                  curlx_uztoui(strlen(nonceCount)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) cnonce,
                  curlx_uztoui(strlen(cnonce)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) qop,
                  curlx_uztoui(strlen(qop)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);

  Curl_MD5_update(ctxt, (const unsigned char *) HA2_hex, 2 * MD5_DIGEST_LEN);
  Curl_MD5_final(ctxt, digest);

  for(i = 0; i < MD5_DIGEST_LEN; i++)
    snprintf(&resp_hash_hex[2 * i], 3, "%02x", digest[i]);

  /* Generate the response */
  response = aprintf("username=\"%s\",realm=\"%s\",nonce=\"%s\","
                     "cnonce=\"%s\",nc=\"%s\",digest-uri=\"%s\",response=%s,"
                     "qop=%s",
                     userp, realm, nonce,
                     cnonce, nonceCount, spn, resp_hash_hex, qop);
  Curl_safefree(spn);
  if(!response)
    return CURLE_OUT_OF_MEMORY;

  /* Base64 encode the response */
  result = Curl_base64_encode(data, response, 0, outptr, outlen);

  Curl_safefree(response);

  return result;
}